

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

size_t __thiscall
CVmObjByteArray::copy_from_buf_undo
          (CVmObjByteArray *this,vm_obj_id_t self,uchar *buf,unsigned_long idx,size_t len)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong cnt;
  ulong __n;
  
  cnt = (*(uint *)(this->super_CVmObject).ext_ - idx) + 1;
  if (len <= cnt) {
    cnt = len;
  }
  save_undo(this,self,idx,cnt);
  for (uVar2 = cnt; uVar2 != 0; uVar2 = uVar2 - __n) {
    uVar1 = (uint)(idx - 1);
    uVar3 = (ulong)(uVar1 & 0x7fff);
    __n = 0x8000 - uVar3;
    if (uVar2 <= __n) {
      __n = uVar2;
    }
    memcpy((void *)(uVar3 + *(long *)(*(long *)((this->super_CVmObject).ext_ +
                                               (idx - 1 >> 0x1c) * 8 + 4) +
                                     (ulong)(uVar1 >> 0xc & 0xfff8))),buf,__n);
    buf = buf + __n;
    idx = idx + __n;
  }
  return cnt;
}

Assistant:

size_t CVmObjByteArray::copy_from_buf_undo(VMG_ vm_obj_id_t self,
                                           const unsigned char *buf,
                                           unsigned long idx, size_t len)
{
    /* limit the size to the remaining length from 'idx' */
    unsigned long avail_len = get_element_count() - idx + 1;
    if (len > avail_len)
        len = (size_t)avail_len;

    /* save undo */
    save_undo(vmg_ self, idx, len);

    /* copy the bytes */
    copy_from_buf(buf, idx, len);

    /* return the copy length */
    return len;
}